

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

void __thiscall wirehair::Codec::SetHeavyRows(Codec *this)

{
  uint8_t *puVar1;
  undefined1 *puVar2;
  uint row_i;
  long lVar3;
  uint col_i;
  ulong uVar4;
  
  puVar2 = &kHeavyMatrix;
  puVar1 = this->_heavy_matrix + (uint)this->_extra_count * this->_heavy_pitch;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    for (uVar4 = 0; uVar4 < this->_heavy_columns; uVar4 = uVar4 + 1) {
      puVar1[uVar4] = puVar2[uVar4];
    }
    puVar2 = puVar2 + 0x12;
    puVar1 = puVar1 + this->_heavy_pitch;
  }
  return;
}

Assistant:

void Codec::SetHeavyRows()
{
    CAT_IF_DUMP(cout << endl << "---- SetHeavyRows ----" << endl << endl;)

    // Skip extra rows
    uint8_t * GF256_RESTRICT heavy_offset = _heavy_matrix + _heavy_pitch * _extra_count;

    uint8_t * GF256_RESTRICT heavy_row = heavy_offset;

    // For each heavy matrix word:
    for (unsigned row_i = 0; row_i < kHeavyRows; ++row_i, heavy_row += _heavy_pitch)
    {
        // NOTE: Each heavy row is a multiple of 4 bytes in size
        for (unsigned col_i = 0; col_i < _heavy_columns; col_i++) {
            heavy_row[col_i] = kHeavyMatrix[row_i][col_i];
        }
    }

#ifdef CAT_IDENTITY_LOWER_RIGHT
    uint8_t * GF256_RESTRICT lower_right = heavy_offset + _heavy_columns - kHeavyRows;

    // Add identity matrix to tie heavy rows to heavy mixing columns
    for (unsigned ii = 0; ii < kHeavyRows; ++ii, lower_right += _heavy_pitch)
    {
        for (unsigned jj = 0; jj < kHeavyRows; ++jj) {
            lower_right[jj] = (ii == jj) ? 1 : 0;
        }
    }
#endif
}